

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plastic.hpp
# Opt level: O2

Color __thiscall
PlasticBSDF::sample_f
          (PlasticBSDF *this,Color *albedo,vec3f *wo,vec3f *wi,float *pdf,bool *isDirac,
          Sampler *sampler)

{
  ulong uVar1;
  float fVar2;
  float extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  Color CVar5;
  float fVar3;
  float fVar4;
  
  fVar2 = DielectricBRDF::reflectivity(ABS(wo->z),*(float *)&(this->super_BSDF).field_0x24);
  (**sampler->_vptr_Sampler)(sampler);
  if (fVar2 <= extraout_XMM0_Da) {
    *isDirac = false;
    fVar3 = fVar2;
    (*sampler->_vptr_Sampler[6])(sampler);
    wi->x = (float)extraout_XMM0_Da_00;
    wi->y = (float)extraout_XMM0_Db;
    wi->z = fVar3;
    *pdf = ((1.0 - fVar2) * fVar3) / PI;
    if (wo->z <= 0.0 && wo->z != 0.0) {
      wi->z = -wi->z;
    }
    CVar5 = f(this,albedo,wo,wi);
    fVar4 = CVar5.z;
    fVar2 = CVar5.x;
    fVar3 = CVar5.y;
  }
  else {
    *pdf = fVar2;
    *isDirac = true;
    fVar3 = wo->z;
    uVar1._0_4_ = wo->x;
    uVar1._4_4_ = wo->y;
    wi->x = (float)(int)(uVar1 ^ 0x8000000080000000);
    wi->y = (float)(int)((uVar1 ^ 0x8000000080000000) >> 0x20);
    wi->z = fVar3;
    fVar2 = fVar2 / ABS(fVar3);
    fVar3 = fVar2;
    fVar4 = fVar2;
  }
  CVar5.y = fVar3;
  CVar5.x = fVar2;
  CVar5.z = fVar4;
  return CVar5;
}

Assistant:

Color sample_f(const Color& albedo, const vec3f& wo, vec3f& wi, float& pdf, bool& isDirac, Sampler& sampler) const
	{
		float r = DielectricBRDF::reflectivity(fabs(wo.z), IOR);
		// specular reflection
		if (sampler.get1f() < r) {
			pdf = r;
			isDirac = true;
			wi = vec3f(-wo.x, -wo.y, wo.z);
			return r / fabs(wi.z);
		}
		// diffuse reflection
		isDirac = false;
		// wi from inner surface
		wi = sampler.cosSampleHemisphereSurface();
		pdf = (1-r) * wi.z / PI;
		if (wo.z<0) wi.z *= -1;
		return f(albedo, wo, wi);
		// wi = sampler.cosSampleHemisphereSurface();
		// pdf = wi.z/PI;
		// if (wo.z<0) wi.z *= -1;
		// return f(wo, wi);
		// // diffuse component only !!!!!!!
	}